

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int string_cmp_chars(http_string_t string,char *chars)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar3 = strlen(chars);
  uVar2 = 0;
  if (sVar3 == string.len) {
    if ((int)(uint)string.len < 1) {
      uVar2 = 1;
    }
    else if (*string.value == *chars) {
      uVar5 = (ulong)((uint)string.len & 0x7fffffff);
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar5 == uVar4) break;
        uVar1 = uVar4 + 1;
      } while (string.value[uVar4] == chars[uVar4]);
      uVar2 = (uint)(uVar5 <= uVar4);
    }
  }
  return uVar2;
}

Assistant:

int string_cmp_chars(http_string_t string, char const chars[static 1]) {
    return strlen(chars) == string.len && nh_string_cmp(string.value, chars, string.len);
}